

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Sintatico::expressao_simples(Sintatico *this)

{
  bool bVar1;
  int token_consumir;
  
  token_consumir = 7;
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,7);
  if (!bVar1) {
    token_consumir = 8;
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,8);
    if (!bVar1) goto LAB_00102f7d;
  }
  eat(this,token_consumir);
LAB_00102f7d:
  do {
    termo(this);
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,7);
    if (!bVar1) {
      bVar1 = Tokens::isEqual((Tokens *)this,this->tok,8);
      if (!bVar1) {
        return;
      }
    }
    operador_aditivo(this);
  } while( true );
}

Assistant:

void Sintatico::expressao_simples() {
  if (isEqual(tok, MAIS)) eat(MAIS);
  else if (isEqual(tok, MENOS)) eat(MENOS);
  termo();
  while (isEqual(tok,MAIS) ||
         isEqual(tok,MENOS)) {
    operador_aditivo();
    // cout << "vai dar merda...\n";
    termo();
    // cout << "..deu merda\n";
  }
  // cout << "cabou expressao\n";
}